

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_do(connectdata *conn,_Bool *done)

{
  Curl_easy *pCVar1;
  undefined4 *puVar2;
  CURLcode CVar3;
  char *pcVar4;
  char *pcVar5;
  
  *done = false;
  pCVar1 = conn->data;
  CVar3 = Curl_urldecode(pCVar1,(pCVar1->state).up.path + 1,0,
                         (char **)((long)(pCVar1->req).protop + 8),(size_t *)0x0,true);
  if (CVar3 == CURLE_OK) {
    pCVar1 = conn->data;
    pcVar4 = (pCVar1->set).str[6];
    CVar3 = CURLE_OK;
    if (pcVar4 != (char *)0x0) {
      CVar3 = Curl_urldecode(pCVar1,pcVar4,0,(char **)((long)(pCVar1->req).protop + 0x10),
                             (size_t *)0x0,true);
    }
    if (CVar3 == CURLE_OK) {
      pCVar1 = conn->data;
      (pCVar1->req).size = -1;
      Curl_pgrsSetUploadCounter(pCVar1,0);
      Curl_pgrsSetDownloadCounter(pCVar1,0);
      Curl_pgrsSetUploadSize(pCVar1,-1);
      Curl_pgrsSetDownloadSize(pCVar1,-1);
      pCVar1 = conn->data;
      if (((pCVar1->set).field_0x913 & 0x10) != 0) {
        *(undefined4 *)(pCVar1->req).protop = 1;
      }
      *done = false;
      puVar2 = (undefined4 *)(pCVar1->req).protop;
      if (**(char **)(puVar2 + 2) == '\0') {
        pcVar4 = "LIST";
      }
      else {
        pcVar4 = "RETR";
        if (((pCVar1->set).field_0x911 & 0x20) != 0) {
          *puVar2 = 1;
          pcVar4 = "LIST";
        }
      }
      pcVar5 = *(char **)(puVar2 + 4);
      if (**(char **)(puVar2 + 2) == '\0') {
        if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
          pcVar5 = pcVar4;
        }
        CVar3 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s",pcVar5);
      }
      else {
        if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
          pcVar5 = pcVar4;
        }
        CVar3 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s %s",pcVar5);
      }
      if (CVar3 == CURLE_OK) {
        (conn->proto).imapc.state = IMAP_FETCH;
        CVar3 = pop3_multi_statemach(conn,done);
        return CVar3;
      }
    }
  }
  return CVar3;
}

Assistant:

static CURLcode pop3_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = pop3_parse_url_path(conn);
  if(result)
    return result;

  /* Parse the custom request */
  result = pop3_parse_custom_request(conn);
  if(result)
    return result;

  result = pop3_regular_transfer(conn, done);

  return result;
}